

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O3

bool __thiscall Assimp::OptimizeMeshesProcess::IsActive(OptimizeMeshesProcess *this,uint pFlags)

{
  uint uVar1;
  
  if ((pFlags >> 0x15 & 1) != 0) {
    this->pts = (bool)((byte)(pFlags >> 0xf) & 1);
    uVar1 = 0xdeadbeef;
    if (-1 < (char)pFlags) {
      uVar1 = this->max_verts;
    }
    this->max_verts = uVar1;
  }
  return (bool)((byte)(pFlags >> 0x15) & 1);
}

Assistant:

bool OptimizeMeshesProcess::IsActive( unsigned int pFlags) const
{
    // Our behaviour needs to be different if the SortByPType or SplitLargeMeshes
    // steps are active. Thus we need to query their flags here and store the
    // information, although we're breaking const-correctness.
    // That's a serious design flaw, consider redesign.
    if( 0 != (pFlags & aiProcess_OptimizeMeshes) ) {
        pts = (0 != (pFlags & aiProcess_SortByPType));
        max_verts = ( 0 != ( pFlags & aiProcess_SplitLargeMeshes ) ) ? DeadBeef : max_verts;
        return true;
    }
    return false;
}